

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_flush_result(cram_fd *fd)

{
  undefined8 *puVar1;
  cram_container *c;
  bool bVar2;
  int iVar3;
  t_pool_result *r;
  int ret;
  uint uVar4;
  long lVar5;
  
  uVar4 = 0;
  do {
    r = t_pool_next_result(fd->rqueue);
    if (r == (t_pool_result *)0x0) {
      return uVar4;
    }
    puVar1 = (undefined8 *)r->data;
    bVar2 = puVar1 != (undefined8 *)0x0;
    if (puVar1 == (undefined8 *)0x0) {
      iVar3 = 0;
LAB_001317c6:
      t_pool_delete_result(r,iVar3);
    }
    else {
      fd = (cram_fd *)*puVar1;
      c = (cram_container *)puVar1[1];
      iVar3 = cram_flush_container2(fd,c);
      if (iVar3 == 0) {
        if (0 < c->max_slice) {
          lVar5 = 0;
          do {
            cram_free_slice(c->slices[lVar5]);
            c->slices[lVar5] = (cram_slice *)0x0;
            lVar5 = lVar5 + 1;
          } while (lVar5 < c->max_slice);
        }
        c->slice = (cram_slice *)0x0;
        c->curr_slice = 0;
        cram_free_container(c);
        iVar3 = hflush(fd->fp);
        uVar4 = uVar4 | -(uint)(iVar3 != 0);
        iVar3 = 1;
        goto LAB_001317c6;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return -1;
    }
  } while( true );
}

Assistant:

static int cram_flush_result(cram_fd *fd) {
    int i, ret = 0;
    t_pool_result *r;

    while ((r = t_pool_next_result(fd->rqueue))) {
	cram_job *j = (cram_job *)r->data;
	cram_container *c;

	if (!j) {
	    t_pool_delete_result(r, 0);
	    return -1;
	}

	fd = j->fd;
	c = j->c;

	if (0 != cram_flush_container2(fd, c))
	    return -1;

	/* Free the container */
	for (i = 0; i < c->max_slice; i++) {
	    cram_free_slice(c->slices[i]);
	    c->slices[i] = NULL;
	}

	c->slice = NULL;
	c->curr_slice = 0;

	cram_free_container(c);

	ret |= hflush(fd->fp) == 0 ? 0 : -1;

	t_pool_delete_result(r, 1);
    }

    return ret;
}